

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RemoveContextHook(ImGuiContext *ctx,ImGuiID hook_id)

{
  int iVar1;
  ImGuiContextHook *pIVar2;
  long lVar3;
  int n;
  long lVar4;
  
  iVar1 = (ctx->Hooks).Size;
  lVar3 = 4;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pIVar2 = (ctx->Hooks).Data;
    if (*(ImGuiID *)(pIVar2 + lVar3 + -4) == hook_id) {
      *(undefined4 *)(pIVar2 + lVar3) = 7;
    }
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void ImGui::RemoveContextHook(ImGuiContext* ctx, ImGuiID hook_id)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook_id != 0);
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].HookId == hook_id)
            g.Hooks[n].Type = ImGuiContextHookType_PendingRemoval_;
}